

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGTexture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmXe_LPGTextureCalc::FillTexPlanar
          (GmmXe_LPGTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  GMM_RESOURCE_FORMAT GVar1;
  GMM_TILE_MODE GVar2;
  anon_struct_8_45_9b07292e_for_Gpu aVar3;
  PlatformInfo *pPVar4;
  Context *pCVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  GMM_STATUS GVar12;
  GMM_PLATFORM_INFO *pGVar13;
  ulong uVar14;
  GMM_GFX_SIZE_T GVar15;
  byte bVar16;
  anon_struct_8_44_94931171_for_Info aVar17;
  uint uVar18;
  uint uVar19;
  uint32_t NumSamples;
  int iVar20;
  uint uVar21;
  uint32_t uVar22;
  uint Height;
  GMM_STATUS GVar23;
  bool bVar24;
  uint local_34 [2];
  uint32_t WidthBytesPhysical;
  
  if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return GMM_ERROR;
  }
  pGVar13 = GmmGetPlatformInfo((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                               super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                               super_GmmTextureCalc.pGmmLibContext);
  pTexInfo->TileMode = SUB84((pTexInfo->Flags).Gpu,4) >> 8 & LEGACY_TILE_Y;
  uVar18 = pTexInfo->BitsPerPixel * (int)pTexInfo->BaseWidth;
  local_34[0] = uVar18 >> 3;
  GVar1 = pTexInfo->Format;
  Height = pTexInfo->BaseHeight;
  GVar23 = GMM_ERROR;
  switch(GVar1) {
  case GMM_FORMAT_I420:
  case GMM_FORMAT_IYUV:
  case GMM_FORMAT_YV12:
  case GMM_FORMAT_YVU9:
    bVar24 = GVar1 == GMM_FORMAT_YVU9;
    uVar21 = (uint)!bVar24 * 2 | 0xfffffffc;
    uVar21 = ((Height + 1 + (uint)bVar24 * 2 & uVar21) *
              (local_34[0] + 1 + (uint)bVar24 * 2 & uVar21) >> bVar24 * '\x02' + 2) * 2;
    if (7 < uVar18) {
      uVar21 = ((uVar21 - 1) + Height * local_34[0] + local_34[0]) / local_34[0];
    }
    aVar17 = (anon_struct_8_44_94931171_for_Info)
             ((ulong)(pTexInfo->Flags).Info & 0xffffffd7fff7ffff | 0x80000);
    (pTexInfo->Flags).Info = aVar17;
    (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 1;
    uVar14 = 0xffffff97ffffffff;
    if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar14 = 0xffffefd7ffffffff;
    }
    aVar17 = (anon_struct_8_44_94931171_for_Info)(uVar14 & (ulong)aVar17);
    (pTexInfo->Flags).Info = aVar17;
    uVar14 = 0xffffffc7ffffffff;
    if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar14 = 0xfffff7d7ffffffff;
    }
    (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar14 & (ulong)aVar17);
    bVar24 = false;
    uVar18 = 0;
    goto LAB_001b6756;
  case GMM_FORMAT_IMC1:
  case GMM_FORMAT_IMC3:
  case GMM_FORMAT_MFX_JPEG_YUV420:
  case GMM_FORMAT_MFX_JPEG_YUV422V:
    uVar18 = Height + 1 >> 1;
    break;
  case GMM_FORMAT_IMC2:
  case GMM_FORMAT_IMC4:
    Height = Height + 0xf & 0xfffffff0;
    uVar18 = Height >> 1;
    uVar21 = uVar18 + Height;
    goto LAB_001b670c;
  case GMM_FORMAT_L4A4:
  case GMM_FORMAT_P8:
  case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
  case GMM_FORMAT_R24G8_TYPELESS:
  case GMM_FORMAT_R32G8X24_TYPELESS:
  case GMM_FORMAT_RENDER_8BIT:
  case GMM_FORMAT_Y1_UNORM:
  case GMM_FORMAT_Y8_UNORM_VA:
  case GMM_FORMAT_Y16_SNORM:
  case GMM_FORMAT_Y16_UNORM:
  case GMM_FORMAT_Y32_UNORM:
  case GMM_FORMAT_Y210:
  case GMM_FORMAT_Y212:
  case GMM_FORMAT_Y410:
  case GMM_FORMAT_Y412:
  case GMM_FORMAT_Y216:
  case GMM_FORMAT_Y416:
  case GMM_FORMAT_UYVY_2x1:
  case GMM_FORMAT_VYUY_2x1:
  case GMM_FORMAT_YUY2_2x1:
  case GMM_FORMAT_YVYU_2x1:
  case GMM_FORMAT_MEDIA_Y1_UNORM:
  case GMM_FORMAT_MEDIA_Y8_UNORM:
  case GMM_FORMAT_MEDIA_Y16_SNORM:
  case GMM_FORMAT_MEDIA_Y16_UNORM:
  case GMM_FORMAT_MEDIA_Y32_UNORM:
  case GMM_FORMAT_B16G16R16A16_UNORM:
    goto switchD_001b6595_caseD_155;
  case GMM_FORMAT_MFX_JPEG_YUV411:
  case GMM_FORMAT_MFX_JPEG_YUV422H:
  case GMM_FORMAT_MFX_JPEG_YUV444:
    goto switchD_001b6595_caseD_156;
  case GMM_FORMAT_MFX_JPEG_YUV411R:
    uVar18 = Height + 3 >> 2;
    break;
  case GMM_FORMAT_NV11:
  case GMM_FORMAT_P208:
  case GMM_FORMAT_P216:
    uVar18 = Height;
    goto LAB_001b66b7;
  case GMM_FORMAT_NV12:
  case GMM_FORMAT_NV21:
  case GMM_FORMAT_P010:
  case GMM_FORMAT_P012:
  case GMM_FORMAT_P016:
    uVar18 = Height + 1 >> 1;
LAB_001b66b7:
    uVar21 = uVar18 + Height;
    if ((GVar1 - GMM_FORMAT_NV12 < 0x24) &&
       ((0x80000007bU >> ((ulong)(GVar1 - GMM_FORMAT_NV12) & 0x3f) & 1) != 0)) {
LAB_001b670c:
      local_34[0] = local_34[0] + 1 & 0xfffffffe;
      (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 2;
    }
    else {
      aVar17 = (anon_struct_8_44_94931171_for_Info)
               ((ulong)(pTexInfo->Flags).Info & 0xffffffd7fff7ffff | 0x80000);
      (pTexInfo->Flags).Info = aVar17;
      uVar14 = 0xffffff97ffffffff;
      if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                   super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                  pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
        uVar14 = 0xffffefd7ffffffff;
      }
      aVar17 = (anon_struct_8_44_94931171_for_Info)(uVar14 & (ulong)aVar17);
      (pTexInfo->Flags).Info = aVar17;
      if (((uint)(((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                   super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                  pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
        uVar14 = 0xfffff7d7ffffffff;
      }
      else {
        uVar14 = 0xffffffc7ffffffff;
      }
      (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)((ulong)aVar17 & uVar14);
    }
    bVar24 = true;
    goto LAB_001b6756;
  case GMM_FORMAT_RGBP:
    goto switchD_001b6595_caseD_168;
  default:
    if (GVar1 != GMM_FORMAT_BGRP) {
      return GMM_ERROR;
    }
    goto switchD_001b6595_caseD_168;
  }
  uVar18 = uVar18 + 0xf & 0xfffffff0;
  Height = Height + 0xf & 0xfffffff0;
  uVar21 = Height + uVar18 * 2;
  (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 3;
  bVar24 = false;
LAB_001b6756:
  GmmTextureCalc::SetTileMode((GmmTextureCalc *)this,pTexInfo);
  aVar3 = (pTexInfo->Flags).Gpu;
  if (((aVar3._0_4_ >> 0x10 & 1) != 0) &&
     ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1850) == 0)) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar3 & 0xfffffffffffeffff);
  }
  aVar3 = (pTexInfo->Flags).Gpu;
  if ((((ulong)aVar3 & 2) != 0) && ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1850) == 0)) {
    (pTexInfo->Flags).Gpu = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)aVar3 & 0xfffffddffffefffd);
  }
  if ((((pTexInfo->Flags).Info.field_0x2 & 8) != 0) && (((uint)(pTexInfo->Flags).Wa & 0x10) == 0)) {
    uVar19 = pRestrictions->PitchAlignment;
    uVar11 = pRestrictions->RenderPitchAlignment;
    uVar6 = pRestrictions->LockPitchAlignment;
    uVar7 = pRestrictions->MinPitch;
    pRestrictions->PitchAlignment = (uint)(uVar19 < 0x40) * 0x40 | (uVar19 >= 0x40) * uVar19;
    pRestrictions->RenderPitchAlignment = (uint)(uVar11 < 0x40) * 0x40 | (uVar11 >= 0x40) * uVar11;
    pRestrictions->LockPitchAlignment = (uint)(uVar6 < 0x40) * 0x40 | (uVar6 >= 0x40) * uVar6;
    pRestrictions->MinPitch = (uint)(uVar7 < 0x40) * 0x40 | (uVar7 >= 0x40) * uVar7;
  }
  uVar19 = pTexInfo->Format - GMM_FORMAT_I420;
  if ((uVar19 < 0x27) && ((0x6000002003U >> ((ulong)uVar19 & 0x3f) & 1) != 0)) {
    pRestrictions->PitchAlignment =
         pRestrictions->PitchAlignment << (pTexInfo->Format == GMM_FORMAT_YVU9) + 1;
    pRestrictions->RenderPitchAlignment = pRestrictions->RenderPitchAlignment;
    pRestrictions->LockPitchAlignment = pRestrictions->LockPitchAlignment;
    pRestrictions->MinPitch = pRestrictions->MinPitch;
  }
  uVar19 = uVar21 + 1 & 0xfffffffe;
  GmmTextureCalc::FindMipTailStartLod((GmmTextureCalc *)this,pTexInfo);
  uVar21 = uVar18;
  if (((((((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
           super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext)->WaTable).field_0x9 & 0x10)
        != 0) && (bVar8 = GmmIsYUVFormatLCUAligned(pTexInfo->Format), bVar8)) && (uVar18 != 0)) {
    uVar21 = uVar18 + 0x3f & 0xffffffc0;
    uVar19 = (uVar21 - uVar18) + uVar19;
  }
  GVar2 = pTexInfo->TileMode;
  if ((pGVar13->TileInfo[GVar2].LogicalSize == 0) ||
     (aVar3 = (pTexInfo->Flags).Gpu, ((ulong)aVar3 & 0x20000000000) != 0)) {
    aVar3 = (pTexInfo->Flags).Gpu;
    if (((ulong)aVar3 & 0x20000000000) != 0) {
      uVar22 = (((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                pGmmLibContext)->pPlatformInfo->Data).TileInfo[GVar2].LogicalTileHeight;
      if ((pTexInfo->Format == GMM_FORMAT_IMC4) || (pTexInfo->Format == GMM_FORMAT_IMC2)) {
        uVar21 = pTexInfo->CCSModeAlign + 0xd;
        uVar11 = pTexInfo->CCSModeAlign + 0x12;
        uVar19 = 0;
        if (0xb < uVar11) {
          uVar19 = uVar11;
        }
        if (uVar21 < 8) {
          uVar19 = uVar21;
        }
        uVar9 = pGVar13->TileInfo[uVar19].LogicalTileWidth;
        local_34[0] = uVar9 * -2 & (local_34[0] - 1) + uVar9 * 2;
      }
      NumSamples = 1;
      uVar9 = 1;
      if (((ulong)aVar3 & 0x20000040) != 0) {
        uVar9 = (pTexInfo->MSAA).NumSamples;
      }
      local_34[0] = GmmTextureCalc::ExpandWidth
                              ((GmmTextureCalc *)this,local_34[0] / (pTexInfo->BitsPerPixel >> 3),
                               (pTexInfo->Alignment).HAlign,uVar9);
      local_34[0] = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                      super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                      _vptr_GmmTextureCalc[0x16])(this,pTexInfo,(ulong)local_34[0]);
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        NumSamples = (pTexInfo->MSAA).NumSamples;
      }
      uVar9 = GmmTextureCalc::ExpandHeight
                        ((GmmTextureCalc *)this,Height,(pTexInfo->Alignment).VAlign,NumSamples);
      iVar20 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                 _vptr_GmmTextureCalc[0x17])(this,pTexInfo,(ulong)uVar9);
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
        uVar9 = 1;
      }
      else {
        uVar9 = (pTexInfo->MSAA).NumSamples;
      }
      uVar9 = GmmTextureCalc::ExpandHeight
                        ((GmmTextureCalc *)this,uVar18,(pTexInfo->Alignment).VAlign,uVar9);
      iVar10 = (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                 _vptr_GmmTextureCalc[0x17])(this,pTexInfo,(ulong)uVar9);
      uVar19 = (iVar10 + (uVar22 - 1) & -uVar22) + (iVar20 + -1 + uVar22 & -uVar22);
    }
  }
  else {
    pPVar4 = ((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
              super_GmmGen9TextureCalc.super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo;
    uVar19 = (pPVar4->Data).TileInfo[GVar2].LogicalTileWidth;
    uVar22 = (pPVar4->Data).TileInfo[GVar2].LogicalTileHeight;
    (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.IsTileAlignedPlanes = true;
    if ((((ulong)aVar3 & 2) != 0) &&
       (pCVar5 = (this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                 super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.super_GmmTextureCalc.
                 pGmmLibContext, ((pCVar5->SkuTable).field_1.field_0x3 & 2) == 0)) {
      uVar14 = *(ulong *)&(pCVar5->WaTable).field_0x4;
      if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1040) == 0) {
        bVar16 = ((uVar14 >> 0x2f & 1) == 0) << 2 | 2;
        if ((uVar14 >> 0x2e & 1) != 0) {
          bVar16 = 0;
        }
      }
      else {
        bVar16 = ((uVar14 & 0xc00000000000) == 0) << 2;
      }
      uVar22 = uVar22 << bVar16;
    }
    if ((pTexInfo->Format == GMM_FORMAT_IMC4) || (pTexInfo->Format == GMM_FORMAT_IMC2)) {
      uVar11 = local_34[0];
      if (uVar19 != 0) {
        uVar11 = ((uVar19 - 1) + local_34[0]) / uVar19;
      }
      if ((uVar11 & 1) != 0) {
        local_34[0] = (uVar11 + 1) * uVar19;
      }
    }
    iVar20 = uVar22 - 1;
    uVar11 = -uVar22;
    if (bVar24) {
      uVar19 = iVar20 + uVar21 & uVar11;
    }
    else {
      uVar19 = (uVar21 + iVar20 & uVar11) + (uVar18 + iVar20 & uVar11);
    }
    uVar19 = uVar19 + ((uVar22 - 1) + Height & uVar11);
    aVar17 = (pTexInfo->Flags).Info;
    if (((ulong)aVar17 & 0x106000000000) != 0) {
      (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)((ulong)aVar17 | 0x10000000);
    }
  }
  if (((pTexInfo->Flags).Info.field_0x3 & 0x10) != 0) {
    GmmTextureCalc::RedescribeTexturePlanes((GmmTextureCalc *)this,pTexInfo,local_34);
  }
  GVar12 = GmmTextureCalc::FillTexPitchAndSize
                     ((GmmTextureCalc *)this,pTexInfo,(ulong)local_34[0],uVar19,pRestrictions);
  if (GVar12 == GMM_SUCCESS) {
    (*(this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.super_GmmGen10TextureCalc.
      super_GmmGen9TextureCalc.super_GmmTextureCalc._vptr_GmmTextureCalc[0x28])(this,pTexInfo);
  }
  GVar23 = GVar12;
  if (1 < (ulong)pTexInfo->ArraySize) {
    GVar15 = (ulong)pTexInfo->ArraySize * pTexInfo->Size;
    GVar23 = GMM_ERROR;
    if (GVar15 - pGVar13->SurfaceMaxSize == 0 || (long)GVar15 < pGVar13->SurfaceMaxSize) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = pTexInfo->Size;
      pTexInfo->Size = GVar15;
      GVar23 = GVar12;
    }
  }
switchD_001b6595_caseD_155:
  return GVar23;
switchD_001b6595_caseD_168:
  if (((pTexInfo->Flags).Info.field_0x2 & 8) == 0) {
switchD_001b6595_caseD_156:
    Height = Height + 0xf & 0xfffffff0;
  }
  uVar21 = Height * 3;
  (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = 3;
  bVar24 = false;
  uVar18 = Height;
  goto LAB_001b6756;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmXe_LPGTextureCalc::FillTexPlanar(GMM_TEXTURE_INFO * pTexInfo,
                                                                   __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   WidthBytesPhysical, Height, YHeight, VHeight;
    uint32_t   AdjustedVHeight = 0;
    GMM_STATUS Status;
    bool       UVPacked = false;
    uint32_t   BitsPerPixel, AlignedWidth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(!pTexInfo->Flags.Info.TiledW);
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    AlignedWidth = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    if(!pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        pTexInfo->TileMode = TILE_NONE;
    }
    else
    {
        pTexInfo->TileMode = LEGACY_TILE_Y;
    }

    WidthBytesPhysical = AlignedWidth * BitsPerPixel >> 3;
    Height = VHeight = 0;

    YHeight = pTexInfo->BaseHeight;

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1: // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420: // Same as IMC3.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UUUU
        // UUUU
        // VVVV
        // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height                                      = YHeight + 2 * VHeight; // One VHeight for V and one for U.
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
            //YYYYYYYY
            //YYYYYYYY
            //YYYYYYYY
            //YYYYYYYY
            //UUUUUUUU
            //VVVVVVVV
            {
                VHeight = GFX_ALIGN(GFX_CEIL_DIV(YHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411: // Similar to IMC3 but U/V are quarter width and full height.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UU
        // UU
        // UU
        // UU
        // VV
        // VV
        // VV
        // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // YYYYYYYY
        // UUUU
        // UUUU
        // UUUU
        // UUUU
        // VVVV
        // VVVV
        // VVVV
        // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
#if _WIN32
        case GMM_FORMAT_WGBOX_YUV444:
        case GMM_FORMAT_WGBOX_PLANAR_YUV444:
#endif
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // UUUUUUUU
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            // VVVVVVVV
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
                break;
            }
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        {
            //For RGBP linear Tile keep resource Offset non aligned and for other Tile format to be 16-bit aligned
            if(pTexInfo->Flags.Info.Linear)
            {
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
            }
            else
            {
                YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                VHeight = YHeight;

                Height                                      = YHeight + 2 * VHeight;
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 3;
            }
            break;
        }
        case GMM_FORMAT_IMC2: // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            YHeight = GFX_ALIGN(YHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            VHeight = GFX_CEIL_DIV(YHeight, 2);

            WidthBytesPhysical = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.

            Height = YHeight + VHeight;

            // With SURFACE_STATE.XOffset support, the U-V interface has
            // much lighter restrictions--which will be naturally met by
            // surface pitch restrictions (i.e. dividing an IMC2/4 pitch
            // by 2--to get the U/V interface--will always produce a safe
            // XOffset value).
            // Not technically UV packed but sizing works out the same
            // if the resource is std swizzled
            UVPacked                                    = true;
            pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 2;
            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(YHeight, 2); // U/V plane half of Y
                Height  = YHeight + VHeight;
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
                Height  = YHeight + VHeight;
            }

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016) ||
               (pTexInfo->Format == GMM_FORMAT_P208) ||
               (pTexInfo->Format == GMM_FORMAT_P216))
            {
                WidthBytesPhysical                          = GFX_ALIGN(WidthBytesPhysical, 2); // If odd YWidth, pitch bumps-up to fit rounded-up U/V planes.
                pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 2;
            }
            else //if(pTexInfo->Format == GMM_FORMAT_NV11)
            {
                // Tiling not supported, since YPitch != UVPitch...
                pTexInfo->Flags.Info.TiledYf = 0;
                pTexInfo->Flags.Info.TiledX  = 0;
                pTexInfo->Flags.Info.Linear  = 1;
                GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
                GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            }

            UVPacked = true;
            break;
        }
        case GMM_FORMAT_I420: // IYUV & I420: are identical to YV12 except,
        case GMM_FORMAT_IYUV: // U & V pl.s are reversed.
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, UVSize, YVSizeRShift;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = WidthBytesPhysical * YHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(WidthBytesPhysical, YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(YHeight, YSizeForUVPurposesDimensionalAlignment);

            UVSize = 2 * // <-- U + V
                     (YSizeForUVPurposes >> YVSizeRShift);

            Height = GFX_CEIL_DIV(YSize + UVSize, WidthBytesPhysical);

            // Tiling not supported, since YPitch != UVPitch...
            pTexInfo->Flags.Info.TiledYf                = 0;
            pTexInfo->Flags.Info.TiledX                 = 0;
            pTexInfo->Flags.Info.Linear                 = 1;
            pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = 1;
            GMM_SET_64KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);
            GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unexpected format");
            return GMM_ERROR;
        }
    }

    // Align Height to even row to avoid hang if HW over-fetch
    Height = GFX_ALIGN(Height, __GMM_EVEN_ROW);

    SetTileMode(pTexInfo);

    // If the Surface has Odd height dimension, we will fall back to Linear Format.
    // If MMC is enabled, disable MMC during such cases.
    if(pTexInfo->Flags.Gpu.MMC)
    {
        if(!(GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags)))
        {
            pTexInfo->Flags.Gpu.MMC = 0;
        }
    }

    // If the Surface has Odd height dimension, we will fall back to Linear Format.
    // If MMC is enabled, disable .CCS/UnifiedAuxSurface during such cases.
    if(pTexInfo->Flags.Gpu.CCS)
    {
        if(!(GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
           !(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs && GMM_IS_4KB_TILE(pTexInfo->Flags)))
        {
            pTexInfo->Flags.Gpu.MMC               = 0;
            pTexInfo->Flags.Gpu.CCS               = 0;
            pTexInfo->Flags.Gpu.UnifiedAuxSurface = 0;
            pTexInfo->Flags.Gpu.__NonMsaaTileYCcs = 0;
        }
    }

    // Legacy Planar "Linear Video" Restrictions...
    if(pTexInfo->Flags.Info.Linear && !pTexInfo->Flags.Wa.NoLegacyPlanarLinearVideoRestrictions)
    {
        pRestrictions->LockPitchAlignment   = GFX_MAX(pRestrictions->LockPitchAlignment, GMM_BYTES(64));
        pRestrictions->MinPitch             = GFX_MAX(pRestrictions->MinPitch, GMM_BYTES(64));
        pRestrictions->PitchAlignment       = GFX_MAX(pRestrictions->PitchAlignment, GMM_BYTES(64));
        pRestrictions->RenderPitchAlignment = GFX_MAX(pRestrictions->RenderPitchAlignment, GMM_BYTES(64));
    }

    // Multiply overall pitch alignment for surfaces whose U/V planes have a
    // pitch down-scaled from that of Y--Since the U/V pitches must meet the
    // original restriction, the Y pitch must meet a scaled-up multiple.
    if((pTexInfo->Format == GMM_FORMAT_I420) ||
       (pTexInfo->Format == GMM_FORMAT_IYUV) ||
       (pTexInfo->Format == GMM_FORMAT_NV11) ||
       (pTexInfo->Format == GMM_FORMAT_YV12) ||
       (pTexInfo->Format == GMM_FORMAT_YVU9))
    {
        uint32_t LShift =
        (pTexInfo->Format != GMM_FORMAT_YVU9) ?
        1 : // UVPitch = 1/2 YPitch
        2;  // UVPitch = 1/4 YPitch

        pRestrictions->LockPitchAlignment <<= LShift;
        pRestrictions->MinPitch <<= LShift;
        pRestrictions->PitchAlignment <<= LShift;
        pRestrictions->RenderPitchAlignment <<= LShift;
    }

    AdjustedVHeight = VHeight;

    FindMipTailStartLod(pTexInfo);

    // In case of Planar surfaces, only the last Plane has to be aligned to 64 for LCU access
    if(pGmmLibContext->GetWaTable().WaAlignYUVResourceToLCU && GmmIsYUVFormatLCUAligned(pTexInfo->Format) && VHeight > 0)
    {
        AdjustedVHeight = GFX_ALIGN(VHeight, GMM_SCANLINES(GMM_MAX_LCU_SIZE));
        Height += AdjustedVHeight - VHeight;
    }

    // For std swizzled and UV packed tile Ys/Yf cases, the planes
    // must be tile-boundary aligned. Actual alignment is handled
    // in FillPlanarOffsetAddress, but height and width must
    // be adjusted for correct size calculation
    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]) &&
       !pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        uint32_t TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        pTexInfo->OffsetInfo.PlaneXe_LPG.IsTileAlignedPlanes = true;

        if(pTexInfo->Flags.Gpu.CCS && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS) // alignment adjustment needed only for aux tables
        {
            if(GMM_IS_64KB_TILE(pTexInfo->Flags))
            {
                TileHeight *= (!WA64K(pGmmLibContext) && !WA16K(pGmmLibContext)) ? 16 : 1; // For 64Kb Tile mode: Multiply TileHeight by 16 for 1 MB alignment
            }
            else
            {
                TileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 64); // For 4k Tile:  Multiply TileHeight by 4 and Pitch by 4 for 64kb alignment, multiply TileHeight by 64 and Pitch by 4 for 1 MB alignment
            }
        }

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
            // If the U & V planes are side-by-side then the surface pitch must be
            // padded out so that U and V planes will being on a tile boundary.
            // This means that an odd Y plane width must be padded out
            // with an additional tile. Even widths do not need padding
            uint32_t TileCols = GFX_CEIL_DIV(WidthBytesPhysical, TileWidth);
            if(TileCols % 2)
            {
                WidthBytesPhysical = (TileCols + 1) * TileWidth;
            }
        }

        Height = GFX_ALIGN(YHeight, TileHeight) + (UVPacked ? GFX_ALIGN(AdjustedVHeight, TileHeight) :
                                                              (GFX_ALIGN(VHeight, TileHeight) + GFX_ALIGN(AdjustedVHeight, TileHeight)));

        if(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf)
        {
            pTexInfo->Flags.Info.RedecribedPlanes = true;
        }
    }
    else if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        uint32_t TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;

        BitsPerPixel = 8;

        if(pTexInfo->Format == GMM_FORMAT_IMC2 || // IMC2, IMC4 needs even tile columns
           pTexInfo->Format == GMM_FORMAT_IMC4)
        {
// If the U & V planes are side-by-side then the surface pitch must be
// padded out so that U and V planes will being on a tile boundary.
// This means that an odd Y plane width must be padded out
// with an additional tile. Even widths do not need padding

// CCS must use padded main surface width, so get main surface TileWidth
#define CCSMODE_TO_TILEMODE(y) ((y + TILE_YF_2D_8bpe) < TILE_YS_1D_8bpe) ? (y + TILE_YF_2D_8bpe) : \
                                                                           ((y + TILE_YF_2D_8bpe + 5) >= TILE_YS_1D_128bpe) ? (y + TILE_YF_2D_8bpe + 5) : TILE_NONE

            uint32_t BaseTileWidth = pPlatform->TileInfo[CCSMODE_TO_TILEMODE(pTexInfo->CCSModeAlign)].LogicalTileWidth;
            WidthBytesPhysical     = GFX_ALIGN(WidthBytesPhysical, 2 * BaseTileWidth);
        }

        AlignedWidth = GFX_ULONG_CAST(WidthBytesPhysical / (pTexInfo->BitsPerPixel >> 3));

        WidthBytesPhysical = __GMM_EXPAND_WIDTH(this, AlignedWidth, pTexInfo->Alignment.HAlign, pTexInfo);
        WidthBytesPhysical = ScaleTextureWidth(pTexInfo, WidthBytesPhysical); //Should both YAux and UVAux use same CCModeALign (ie using common bpe?)
                                                                              //If different, then copy Aux info from per-plane Aux? HW has separate bpe or common?
        YHeight = __GMM_EXPAND_HEIGHT(this, YHeight, pTexInfo->Alignment.VAlign, pTexInfo);
        YHeight = ScaleTextureHeight(pTexInfo, YHeight);
        YHeight = GFX_ALIGN(YHeight, TileHeight);

        VHeight = __GMM_EXPAND_HEIGHT(this, VHeight, pTexInfo->Alignment.VAlign, pTexInfo);
        VHeight = ScaleTextureHeight(pTexInfo, VHeight);
        VHeight = GFX_ALIGN(VHeight, TileHeight);

        Height = YHeight + VHeight;
    }

    if(pTexInfo->Flags.Info.RedecribedPlanes)
    {
        if(false == RedescribeTexturePlanes(pTexInfo, &WidthBytesPhysical))
        {
            __GMM_ASSERT(false);
        }
    }
    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, WidthBytesPhysical, Height, pRestrictions)) == GMM_SUCCESS)
    {
        FillPlanarOffsetAddress(pTexInfo);
    }

    // Planar & hybrid 2D arrays supported in DX11.1+ spec but not HW. Memory layout
    // is defined by SW requirements; Y plane must be 4KB aligned.
    if(pTexInfo->ArraySize > 1)
    {
        GMM_GFX_SIZE_T ElementSizeBytes = pTexInfo->Size;
        int64_t        LargeSize;

        // Size should always be page aligned.
        __GMM_ASSERT((pTexInfo->Size % PAGE_SIZE) == 0);

        if((LargeSize = (int64_t)ElementSizeBytes * pTexInfo->ArraySize) <= pPlatform->SurfaceMaxSize)
        {
            pTexInfo->OffsetInfo.PlaneXe_LPG.ArrayQPitch = ElementSizeBytes;
            pTexInfo->Size                               = LargeSize;
        }
        else
        {
            GMM_ASSERTDPF(0, "Surface too large!");
            Status = GMM_ERROR;
        }
    }

    GMM_DPF_EXIT;
    return (Status);
}